

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutSeq.c
# Opt level: O1

void Cut_NodeNewMergeWithOld(Cut_Man_t *p,int Node)

{
  Cut_Cut_t *pList2;
  Cut_Cut_t *pList1;
  
  pList2 = Cut_NodeReadCutsNew(p,Node);
  if (pList2 == (Cut_Cut_t *)0x0) {
    return;
  }
  Cut_NodeWriteCutsNew(p,Node,(Cut_Cut_t *)0x0);
  pList1 = Cut_NodeReadCutsOld(p,Node);
  if (pList1 != (Cut_Cut_t *)0x0) {
    pList2 = Cut_CutMergeLists(pList1,pList2);
  }
  Cut_NodeWriteCutsOld(p,Node,pList2);
  return;
}

Assistant:

void Cut_NodeNewMergeWithOld( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pListOld, * pListNew, * pList;
    // get the new cuts
    pListNew = Cut_NodeReadCutsNew( p, Node );
    if ( pListNew == NULL )
        return;
    Cut_NodeWriteCutsNew( p, Node, NULL );
    // get the old cuts
    pListOld = Cut_NodeReadCutsOld( p, Node );
    if ( pListOld == NULL )
    {
        Cut_NodeWriteCutsOld( p, Node, pListNew );
        return;
    }
    // merge the lists
    pList = Cut_CutMergeLists( pListOld, pListNew );
    Cut_NodeWriteCutsOld( p, Node, pList );
}